

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void luaV_finishset(lua_State *L,TValue *t,TValue *key,StkId val,TValue *slot)

{
  Table *t_00;
  Table *events;
  undefined4 uVar1;
  uint uVar2;
  TValue *f;
  int iVar3;
  
  iVar3 = 2000;
  do {
    if (slot == (TValue *)0x0) {
      f = luaT_gettmbyobj(L,t,TM_NEWINDEX);
      uVar2 = f->tt_;
      if (uVar2 == 0) {
        luaG_typeerror(L,t,"index");
      }
    }
    else {
      t_00 = (Table *)(t->value_).gc;
      events = t_00->metatable;
      if (((events == (Table *)0x0) || ((events->flags & 2) != 0)) ||
         (f = luaT_gettm(events,TM_NEWINDEX,L->l_G->tmname[1]), f == (TValue *)0x0)) {
        if (slot == &luaO_nilobject_) {
          slot = luaH_newkey(L,t_00,key);
        }
        iVar3 = val->tt_;
        uVar1 = *(undefined4 *)&val->field_0xc;
        slot->value_ = val->value_;
        slot->tt_ = iVar3;
        *(undefined4 *)&slot->field_0xc = uVar1;
        t_00->flags = '\0';
        if ((((val->tt_ & 0x40) != 0) && ((t_00->marked & 4) != 0)) &&
           ((((val->value_).gc)->marked & 3) != 0)) {
          luaC_barrierback_(L,t_00);
          return;
        }
        return;
      }
      uVar2 = f->tt_;
    }
    if ((uVar2 & 0xf) == 6) {
      luaT_callTM(L,f,t,key,val,0);
      return;
    }
    if (uVar2 == 0x45) {
      slot = luaH_get((Table *)(f->value_).gc,key);
      if (slot->tt_ != 0) {
        if ((((val->tt_ & 0x40) != 0) && ((((Table *)(f->value_).gc)->marked & 4) != 0)) &&
           ((((val->value_).gc)->marked & 3) != 0)) {
          luaC_barrierback_(L,(Table *)(f->value_).gc);
        }
        iVar3 = val->tt_;
        uVar1 = *(undefined4 *)&val->field_0xc;
        slot->value_ = val->value_;
        slot->tt_ = iVar3;
        *(undefined4 *)&slot->field_0xc = uVar1;
        return;
      }
    }
    else {
      slot = (TValue *)0x0;
    }
    iVar3 = iVar3 + -1;
    t = f;
  } while (iVar3 != 0);
  luaG_runerror(L,"\'__newindex\' chain too long; possible loop");
}

Assistant:

void luaV_finishset(lua_State *L, const TValue *t, TValue *key,
                    StkId val, const TValue *slot) {
    int loop;  /* counter to avoid infinite loops */
    for (loop = 0; loop < MAXTAGLOOP; loop++) {
        const TValue *tm;  /* '__newindex' metamethod */
        if (slot != NULL) {  /* is 't' a table? */
            Table *h = hvalue(t);  /* save 't' table */
            lua_assert(ttisnil(slot));  /* old value must be nil */
            tm = fasttm(L, h->metatable, TM_NEWINDEX);  /* get metamethod */
            if (tm == NULL) {  /* no metamethod? */
                if (slot == luaO_nilobject)  /* no previous entry? */
                    slot = luaH_newkey(L, h, key);  /* create one */
                /* no metamethod and (now) there is an entry with given key */
                setobj2t(L, cast(TValue * , slot), val);  /* set its new value */
                invalidateTMcache(h);
                luaC_barrierback(L, h, val);
                return;
            }
            /* else will try the metamethod */
        } else {  /* not a table; check metamethod */
            if (ttisnil(tm = luaT_gettmbyobj(L, t, TM_NEWINDEX)))
                luaG_typeerror(L, t, "index");
        }
        /* try the metamethod */
        if (ttisfunction(tm)) {
            luaT_callTM(L, tm, t, key, val, 0);
            return;
        }
        t = tm;  /* else repeat assignment over 'tm' */
        if (luaV_fastset(L, t, key, slot, luaH_get, val))
            return;  /* done */
        /* else loop */
    }
    luaG_runerror(L, "'__newindex' chain too long; possible loop");
}